

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O3

void * duckdb_je_large_ralloc
                 (tsdn_t *tsdn,arena_t *arena,void *ptr,size_t usize,size_t alignment,_Bool zero,
                 tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  _Bool _Var6;
  uint binind;
  ulong uVar7;
  rtree_leaf_elm_t *prVar8;
  void *result;
  size_t alignment_00;
  void **ppvVar9;
  ulong uVar10;
  rtree_t *rtree;
  long lVar11;
  cache_bin_t *bin;
  rtree_ctx_t *prVar12;
  edata_t *edata;
  cache_bin_t *cache_bin;
  rtree_contents_t local_1c8;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    prVar12 = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(prVar12);
  }
  else {
    prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar7 = (ulong)ptr & 0xffffffffc0000000;
  uVar10 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&prVar12->cache[0].leafkey + uVar10);
  uVar10 = *(ulong *)((long)&prVar12->cache[0].leafkey + uVar10);
  if (uVar10 == uVar7) {
    prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (prVar12->l2_cache[0].leafkey == uVar7) {
    prVar8 = prVar12->l2_cache[0].leaf;
    prVar12->l2_cache[0].leafkey = uVar10;
    prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar7;
    puVar1[1] = (ulong)prVar8;
    prVar8 = (rtree_leaf_elm_t *)
             ((long)&(prVar8->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    lVar11 = 0x118;
    do {
      if (*(ulong *)((long)prVar12->cache + lVar11 + -8) == uVar7) {
        uVar4 = *(ulong *)((long)&prVar12->cache[0].leafkey + lVar11);
        puVar2 = (undefined8 *)((long)prVar12->cache + lVar11 + -0x18);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)prVar12->cache + lVar11 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
        *(ulong *)((long)prVar12->cache + lVar11 + -0x18) = uVar10;
        *(ulong *)((long)(prVar12->cache + -1) + lVar11) = puVar1[1];
        *puVar1 = uVar7;
        puVar1[1] = uVar4;
        prVar8 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar4);
        goto LAB_00cdf2fd;
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x188);
    prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard
                       (tsdn,&duckdb_je_arena_emap_global.rtree,prVar12,(uintptr_t)ptr,true,false);
  }
LAB_00cdf2fd:
  edata = (edata_t *)(((long)(prVar8->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80);
  uVar10 = *(ulong *)((long)duckdb_je_sz_index2size_tab +
                     (ulong)((uint)edata->e_bits >> 0x11 & 0x7f8));
  uVar7 = (ulong)zero;
  _Var6 = duckdb_je_large_ralloc_no_move(tsdn,edata,usize,usize,zero);
  if (!_Var6) {
    duckdb_je_hook_invoke_expand
              (hook_args->is_realloc ^ hook_expand_rallocx,ptr,uVar10,usize,(uintptr_t)ptr,
               hook_args->args);
    return edata->e_addr;
  }
  alignment_00 = 0x40;
  if (0x40 < alignment) {
    alignment_00 = alignment;
  }
  result = duckdb_je_large_palloc(tsdn,arena,usize,alignment_00,zero);
  if (result == (void *)0x0) {
    return (void *)0x0;
  }
  duckdb_je_hook_invoke_alloc
            (hook_args->is_realloc ^ hook_alloc_rallocx,result,(uintptr_t)result,hook_args->args);
  duckdb_je_hook_invoke_dalloc(hook_dalloc_rallocx - hook_args->is_realloc,ptr,hook_args->args);
  if (uVar10 < usize) {
    usize = uVar10;
  }
  switchD_015de399::default(result,edata->e_addr,usize);
  prVar12 = (rtree_ctx_t *)edata->e_addr;
  if (tcache == (tcache_t *)0x0) {
    arena_sdalloc_no_tcache(tsdn,prVar12,uVar10);
    return result;
  }
  if (uVar10 < 0x1001) {
    binind = (uint)duckdb_je_sz_size2index_tab[uVar10 + 7 >> 3];
  }
  else {
    binind = sz_size2index_compute(uVar10);
  }
  if (binind < 0x24) {
    cache_bin = tcache->bins + binind;
    ppvVar9 = cache_bin->stack_head;
    if (tcache->bins[binind].low_bits_full == (uint16_t)ppvVar9) {
      if (ppvVar9 == (void **)&duckdb_je_disabled_bin) {
        duckdb_je_arena_dalloc_small(tsdn,prVar12);
        return result;
      }
      duckdb_je_tcache_bin_flush_small
                (&tsdn->tsd,tcache,cache_bin,binind,
                 (uint)(tcache->bins[binind].bin_info.ncached_max >>
                       ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_00cdf582:
      ppvVar9 = cache_bin->stack_head;
      if (cache_bin->low_bits_full == (uint16_t)ppvVar9) {
        return result;
      }
      cache_bin->stack_head = ppvVar9 + -1;
      ppvVar9[-1] = prVar12;
      return result;
    }
LAB_00cdf457:
    cache_bin->stack_head = ppvVar9 + -1;
    ppvVar9[-1] = prVar12;
  }
  else {
    if (binind < tcache->tcache_slow->tcache_nbins) {
      ppvVar9 = tcache->bins[binind].stack_head;
      if (ppvVar9 != (void **)&duckdb_je_disabled_bin) {
        cache_bin = tcache->bins + binind;
        if (tcache->bins[binind].low_bits_full == (uint16_t)ppvVar9) {
          duckdb_je_tcache_bin_flush_large
                    (&tsdn->tsd,tcache,cache_bin,binind,
                     (uint)(tcache->bins[binind].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
          goto LAB_00cdf582;
        }
        goto LAB_00cdf457;
      }
    }
    if (tsdn == (tsdn_t *)0x0) {
      rtree = (rtree_t *)&rtree_ctx_fallback;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
    }
    else {
      rtree = (rtree_t *)
              &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rtree_read(&local_1c8,tsdn,rtree,prVar12,uVar7);
    duckdb_je_large_dalloc(tsdn,local_1c8.edata);
  }
  return result;
}

Assistant:

void *
large_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t usize,
    size_t alignment, bool zero, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);

	size_t oldusize = edata_usize_get(edata);
	/* The following should have been caught by callers. */
	assert(usize > 0 && usize <= SC_LARGE_MAXCLASS);
	/* Both allocation sizes must be large to avoid a move. */
	assert(oldusize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS);

	/* Try to avoid moving the allocation. */
	if (!large_ralloc_no_move(tsdn, edata, usize, usize, zero)) {
		hook_invoke_expand(hook_args->is_realloc
		    ? hook_expand_realloc : hook_expand_rallocx, ptr, oldusize,
		    usize, (uintptr_t)ptr, hook_args->args);
		return edata_addr_get(edata);
	}

	/*
	 * usize and old size are different enough that we need to use a
	 * different size class.  In that case, fall back to allocating new
	 * space and copying.
	 */
	void *ret = large_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	size_t copysize = (usize < oldusize) ? usize : oldusize;
	memcpy(ret, edata_addr_get(edata), copysize);
	isdalloct(tsdn, edata_addr_get(edata), oldusize, tcache, NULL, true);
	return ret;
}